

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommMPI.cpp
# Opt level: O0

undefined8 adios2::helper::CommWithMPI(MPI_Comm mpiComm)

{
  int iVar1;
  undefined *in_RSI;
  undefined8 in_RDI;
  unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_> comm;
  MPI_Comm in_stack_ffffffffffffffa8;
  unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_> *__p;
  CommImplMPI *in_stack_ffffffffffffffb0;
  unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_> *this;
  unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_> local_30;
  unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_> local_28 [3];
  undefined *local_10;
  
  local_10 = in_RSI;
  if (CommWithMPI(ompi_communicator_t*)::initMPI == '\0') {
    iVar1 = __cxa_guard_acquire(&CommWithMPI(ompi_communicator_t*)::initMPI);
    if (iVar1 != 0) {
      anon_unknown_1::InitMPI::InitMPI((InitMPI *)0x1a3441);
      __cxa_guard_release(&CommWithMPI(ompi_communicator_t*)::initMPI);
    }
  }
  if (local_10 == &ompi_mpi_comm_null) {
    adios2::helper::CommDummy();
  }
  else {
    operator_new(0x10);
    CommImplMPI::CommImplMPI(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    __p = local_28;
    std::unique_ptr<adios2::helper::CommImpl,std::default_delete<adios2::helper::CommImpl>>::
    unique_ptr<std::default_delete<adios2::helper::CommImpl>,void>
              ((unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
                *)in_stack_ffffffffffffffb0,(pointer)__p);
    this = &local_30;
    std::unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>::
    unique_ptr(this,__p);
    adios2::helper::CommImpl::MakeComm(in_RDI,this);
    std::unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>::
    ~unique_ptr(this);
    std::unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>::
    ~unique_ptr(this);
  }
  return in_RDI;
}

Assistant:

Comm CommWithMPI(MPI_Comm mpiComm)
{
    static InitMPI const initMPI;
    if (mpiComm == MPI_COMM_NULL)
    {
        return CommDummy();
    }
    auto comm = std::unique_ptr<CommImpl>(new CommImplMPI(mpiComm));
    return CommImpl::MakeComm(std::move(comm));
}